

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::Module>::run(TypedDeleter<LLVMBC::Module> *this)

{
  TypedDeleter<LLVMBC::Module> *this_local;
  
  Module::~Module(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}